

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

DistributionMapping __thiscall PeleLM::getFuncCountDM(PeleLM *this,BoxArray *bxba,int ngrow)

{
  int iVar1;
  element_type *peVar2;
  FabArray<amrex::FArrayBox> *src;
  Periodicity *period;
  int in_ECX;
  int *piVar3;
  undefined4 in_register_00000014;
  BoxArray *bxs;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  Real RVar6;
  double dVar7;
  DistributionMapping DVar8;
  Vector<long,_std::allocator<long>_> vwrk;
  DistributionMapping rr;
  MFIter mfi;
  MultiFab fctmpnew;
  
  bxs = (BoxArray *)CONCAT44(in_register_00000014,ngrow);
  amrex::DistributionMapping::DistributionMapping(&rr);
  peVar2 = (bxs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  amrex::DistributionMapping::RoundRobinProcessorMap
            (&rr,(int)((ulong)((long)*(pointer *)
                                      ((long)&(peVar2->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data + 8) -
                              *(long *)&(peVar2->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data) >> 2) * -0x49249249,
             *(int *)(amrex::ParallelContext::frames + 0x10),true);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  vwrk.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_008378d0;
  amrex::MultiFab::MultiFab
            (&fctmpnew,bxs,&rr,1,0,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&vwrk);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fctmpnew.super_FabArray<amrex::FArrayBox>,1.0,0,
             fctmpnew.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &fctmpnew.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  src = *(FabArray<amrex::FArrayBox> **)
         (*(long *)((long)&bxba[3].m_bat.m_op + 0x34) + 200 + (long)FuncCount_Type * 0xe0);
  RVar6 = amrex::MultiFab::norm0((MultiFab *)src,0,0,false,false);
  if (RVar6 <= 0.0) {
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)this,bxs,*(int *)(amrex::ParallelContext::frames + 0x10));
  }
  else {
    iVar1 = (src->super_FabArrayBase).n_grow.vect[0];
    if (iVar1 < in_ECX) {
      in_ECX = iVar1;
    }
    period = amrex::Periodicity::NonPeriodic();
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = in_ECX;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = in_ECX;
    mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,in_ECX);
    vwrk.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vwrk.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&fctmpnew.super_FabArray<amrex::FArrayBox>,src,0,0,1,(IntVect *)&mfi,(IntVect *)&vwrk
               ,period,COPY,(CPC *)0x0,false);
    peVar2 = (bxs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::vector<long,_std::allocator<long>_>::vector
              (&vwrk.super_vector<long,_std::allocator<long>_>,
               ((long)*(pointer *)
                       ((long)&(peVar2->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7,(allocator_type *)&mfi)
    ;
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&fctmpnew,'\0');
    if (mfi.currentIndex < mfi.endIndex) {
      lVar5 = 0;
      do {
        piVar3 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + mfi.currentIndex;
        }
        dVar7 = amrex::BaseFab<double>::sum<(amrex::RunOn)1>
                          (&fctmpnew.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar3]->
                            super_BaseFab<double>,
                           &(fctmpnew.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar3]->
                            super_BaseFab<double>).domain,(DestComp)0x0,(NumComps)0x1);
        *(long *)((long)vwrk.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar5) = (long)dVar7;
        amrex::MFIter::operator++(&mfi);
        lVar5 = lVar5 + 8;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    amrex::MFIter::~MFIter(&mfi);
    amrex::FabArray<amrex::FArrayBox>::clear(&fctmpnew.super_FabArray<amrex::FArrayBox>);
    amrex::DistributionMapping::DistributionMapping((DistributionMapping *)this);
    amrex::DistributionMapping::KnapSackProcessorMap
              ((DistributionMapping *)this,&vwrk.super_vector<long,_std::allocator<long>_>,
               *(int *)(amrex::ParallelContext::frames + 0x10),(Real *)0x0,true,0x7fffffff,true);
    if (vwrk.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(vwrk.super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vwrk.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vwrk.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  amrex::MultiFab::~MultiFab(&fctmpnew);
  _Var4._M_pi = extraout_RDX;
  if (rr.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rr.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  DVar8.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  DVar8.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar8.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
PeleLM::getFuncCountDM (const BoxArray& bxba, int ngrow)
{
  //
  // Sometimes "mf" is the valid region of the State.
  // Sometimes it's the region covered by AuxBoundaryData.
  // When ngrow>0 were doing AuxBoundaryData with nGrow()==ngrow.
  //
  DistributionMapping rr;
  rr.RoundRobinProcessorMap(bxba.size(),ParallelDescriptor::NProcs());

  MultiFab fctmpnew(bxba, rr, 1, 0);
  fctmpnew.setVal(1);

  const MultiFab& FC = get_new_data(FuncCount_Type);

  // Return original DM if FC is zero (propably Null reaction dir)
  if ( FC.norm0(0) <= 0.0 ) {
     DistributionMapping new_dmap{bxba};
     return new_dmap;
  }

  fctmpnew.ParallelCopy(FC,0,0,1,std::min(ngrow,FC.nGrow()),0);

  int count = 0;
  Vector<long> vwrk(bxba.size());

// FIXME need to be tiled
  for (MFIter mfi(fctmpnew); mfi.isValid(); ++mfi)
     vwrk[count++] = static_cast<long>(fctmpnew[mfi].sum<RunOn::Host>(0));

  fctmpnew.clear();

#ifdef AMREX_USE_MPI
  const int IOProc = ParallelDescriptor::IOProcessorNumber();

  Vector<int> nmtags(ParallelDescriptor::NProcs(),0);
  Vector<int> offset(ParallelDescriptor::NProcs(),0);

  const Vector<int>& procmap = rr.ProcessorMap();

  for (long int i = 0; i < vwrk.size(); i++)
    nmtags[procmap[i]]++;

  AMREX_ASSERT(nmtags[ParallelDescriptor::MyProc()] == count);

  for (long int i = 1; i < offset.size(); i++)
    offset[i] = offset[i-1] + nmtags[i-1];

  Vector<long> vwrktmp;

  if (ParallelDescriptor::IOProcessor()) vwrktmp = vwrk;

  MPI_Gatherv(vwrk.dataPtr(),
              count,
              ParallelDescriptor::Mpi_typemap<long>::type(),
              ParallelDescriptor::IOProcessor() ? vwrktmp.dataPtr() : 0,
              nmtags.dataPtr(),
              offset.dataPtr(),
              ParallelDescriptor::Mpi_typemap<long>::type(),
              IOProc,
              ParallelDescriptor::Communicator());

  if (ParallelDescriptor::IOProcessor())
  {
    //
    // We must now assemble vwrk in the proper order.
    //
    Vector< Vector<int> > table(ParallelDescriptor::NProcs());

    for (long int i = 0; i < vwrk.size(); i++)
      table[procmap[i]].push_back(i);

    int idx = 0;
    for (long int i = 0; i < table.size(); i++)
    {
      Vector<int>& tbl = table[i];
      for (long int j = 0; j < tbl.size(); j++)
        vwrk[tbl[j]] = vwrktmp[idx++];
    }
  }

  vwrktmp.clear();
  //
  // Send the properly-ordered vwrk to all processors.
  //
  ParallelDescriptor::Bcast(vwrk.dataPtr(), vwrk.size(), IOProc);
#endif

  DistributionMapping res;

  res.KnapSackProcessorMap(vwrk,ParallelDescriptor::NProcs());

  return res;
}